

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

PropertyString * __thiscall
Js::ScriptContext::GetPropertyString(ScriptContext *this,PropertyRecord *propertyRecord)

{
  PropertyString *pPVar1;
  
  pPVar1 = TryGetProperty<Js::PropertyString>(this,propertyRecord->pid);
  if (pPVar1 != (PropertyString *)0x0) {
    return pPVar1;
  }
  pPVar1 = CreateAndCacheSymbolOrPropertyString<Js::PropertyString>(this,propertyRecord);
  return pPVar1;
}

Assistant:

PropertyString* ScriptContext::GetPropertyString(const PropertyRecord* propertyRecord)
    {
        return this->GetProperty<PropertyString>(propertyRecord->GetPropertyId(), propertyRecord);
    }